

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double __thiscall pstore::logger::log(logger *this,double __x)

{
  char *in_RDX;
  uint in_ESI;
  double dVar1;
  allocator local_41;
  string local_40 [40];
  czstring message_local;
  logger *plStack_10;
  priority p_local;
  logger *this_local;
  
  plStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RDX,&local_41);
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,local_40);
  std::__cxx11::string::~string(local_40);
  dVar1 = (double)std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const message) {
            this->log (p, std::string{message});
        }